

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O2

void __thiscall celero::Archive::Impl::readExistingResults(Impl *this)

{
  char cVar1;
  long lVar2;
  ArchiveEntry r;
  ifstream is;
  byte abStack_218 [488];
  
  std::ifstream::ifstream((string *)&is);
  std::ifstream::open((string *)&is,(int)this + (_S_out|_S_in));
  cVar1 = std::__basic_file<char>::is_open();
  if ((cVar1 != '\0') && (*(int *)(abStack_218 + *(long *)(_is + -0x18)) == 0)) {
    std::istream::ignore((long)&is,-1);
    while ((abStack_218[*(long *)(_is + -0x18)] & 2) == 0) {
      lVar2 = std::istream::tellg();
      if (lVar2 < 0) break;
      r.GroupName._M_string_length = 0;
      r.GroupName.field_2._M_local_buf[0] = '\0';
      r.RunName._M_dataplus._M_p = (pointer)&r.RunName.field_2;
      r.RunName._M_string_length = 0;
      r.RunName.field_2._M_local_buf[0] = '\0';
      r.FirstRanDate._0_4_ = 0;
      r._84_8_ = 0;
      r.ExperimentValue = 0;
      r.ExperimentValueScale._0_4_ = 0;
      r.ExperimentValueScale._4_4_ = 0;
      r.GroupName._M_dataplus._M_p = (pointer)&r.GroupName.field_2;
      memset(&r.AverageBaseline,0,0xf9);
      operator>>((istream *)&is,&r);
      if (r.GroupName._M_string_length != 0) {
        std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>::push_back(&this->results,&r);
      }
      ArchiveEntry::~ArchiveEntry(&r);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&is);
  return;
}

Assistant:

void readExistingResults()
	{
		// Read in existing results?
		std::ifstream is;
		is.open(this->fileName, std::fstream::in);

		if((is.is_open() == true) && (is.good() == true) && (is.fail() == false))
		{
			// Throw away the header.
			is.ignore(std::numeric_limits<std::streamsize>::max(), '\n');

			// Read in existing results.
			while((is.eof() == false) && (is.tellg() >= 0))
			{
				ArchiveEntry r;
				is >> r;

				if(r.GroupName.empty() == false)
				{
					this->results.push_back(r);
				}
			}

			// Close the file for reading.
			is.close();
		}
	}